

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Cluster.cpp
# Opt level: O3

void __thiscall amrex::ClusterList::intersect(ClusterList *this,BoxArray *domba)

{
  size_t *psVar1;
  Cluster *this_00;
  _List_node_base *p_Var2;
  bool bVar3;
  _Self __tmp;
  _List_node_base *p_Var4;
  BoxDomain bxdom;
  ClusterList clst;
  BoxDomain dom;
  BoxList local_88;
  _List_node_base local_68;
  long local_58;
  BoxDomain local_50;
  
  BoxArray::removeOverlap(domba,true);
  BoxArray::boxList(&local_88,domba);
  BoxDomain::BoxDomain(&local_50,&local_88);
  if (local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  p_Var4 = (this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)this) {
    do {
      this_00 = *(Cluster **)
                 &((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)(p_Var4 + 1))->
                  super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>;
      local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      bVar3 = BoxArray::contains(domba,&this_00->m_bx,true,(IntVect *)&local_88);
      if (bVar3) {
        p_Var4 = (((list<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_> *)&p_Var4->_M_next)->
                 super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>)._M_impl.
                 _M_node.super__List_node_base._M_next;
      }
      else {
        BoxDomain::BoxDomain((BoxDomain *)&local_88);
        amrex::intersect((BoxDomain *)&local_88,&local_50,&this_00->m_bx);
        if ((pointer)CONCAT44(local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._0_4_) !=
            local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start &&
            -1 < (long)CONCAT44(local_88.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                local_88.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_) -
                 (long)local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          local_58 = 0;
          local_68._M_next = &local_68;
          local_68._M_prev = &local_68;
          Cluster::distribute(this_00,(ClusterList *)&local_68,(BoxDomain *)&local_88);
          if (local_68._M_next != &local_68) {
            std::__detail::_List_node_base::_M_transfer((_List_node_base *)this,local_68._M_next);
            psVar1 = &(this->lst).
                      super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>._M_impl.
                      _M_node._M_size;
            *psVar1 = *psVar1 + local_58;
            local_58 = 0;
          }
          ~ClusterList((ClusterList *)&local_68);
        }
        operator_delete(this_00,0x30);
        p_Var2 = p_Var4->_M_next;
        psVar1 = &(this->lst).super__List_base<amrex::Cluster_*,_std::allocator<amrex::Cluster_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var4,0x18);
        p_Var4 = p_Var2;
        if (local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_88.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
    } while (p_Var4 != (_List_node_base *)this);
  }
  BoxArray::clear(domba);
  if (local_50.super_BoxList.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super_BoxList.m_lbox.
                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super_BoxList.m_lbox.
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super_BoxList.m_lbox.
                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
ClusterList::intersect (BoxArray& domba)
{
    BL_PROFILE("ClusterList::intersect()");

    domba.removeOverlap();

    BoxDomain dom(domba.boxList());

    for (std::list<Cluster*>::iterator cli = lst.begin(); cli != lst.end(); )
    {
        Cluster* c = *cli;

        bool assume_disjoint_ba = true;
        if (domba.contains(c->box(),assume_disjoint_ba))
        {
            ++cli;
        }
        else
        {
            BoxDomain bxdom;

            amrex::intersect(bxdom, dom, c->box());

            if (bxdom.size() > 0)
            {
                ClusterList clst;
                c->distribute(clst,bxdom);
                lst.splice(lst.end(),clst.lst);
            }
            //
            // Must explicitly delete c.
            //
            delete c;

            lst.erase(cli++);
        }
    }

    domba.clear();
}